

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_api.cpp
# Opt level: O1

void __thiscall
cppcms::impl::cgi::http::on_error_response_written
          (http *this,error_code *e,size_t param_2,handler *h)

{
  error_code local_18;
  
  if (e->_M_value != 0) {
    booster::callback<void_(const_std::error_code_&)>::operator()(h,e);
    return;
  }
  close(this,(int)e);
  local_18._M_value = 1;
  local_18._M_cat = (error_category *)&cppcms_category;
  booster::callback<void_(const_std::error_code_&)>::operator()(h,&local_18);
  return;
}

Assistant:

void on_error_response_written(booster::system::error_code const &e,size_t,handler const &h)
		{
			if(e) {
				h(e);
				return;
			}
			close();
			h(booster::system::error_code(errc::protocol_violation,cppcms_category));
		}